

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void linenoisePrintKeyCodes(void)

{
  undefined7 uVar1;
  undefined8 uVar2;
  undefined4 in_EAX;
  int iVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  char c;
  char quit [4];
  undefined1 auStack_38 [3];
  char local_35;
  undefined4 local_34;
  
  iVar3 = 0x13aa33;
  puts(
      "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit."
      );
  iVar3 = enableRawMode(iVar3);
  if (iVar3 != -1) {
    _auStack_38 = CONCAT44(0x20202020,in_EAX);
    while( true ) {
      do {
        uVar2 = _auStack_38;
        sVar4 = read(0,&local_35,1);
      } while ((int)sVar4 < 1);
      _auStack_38 = CONCAT24(local_34._1_2_,_auStack_38);
      uVar1 = CONCAT16(local_34._3_1_,_auStack_38);
      local_35 = SUB81(uVar2,3);
      uVar5 = (uint)local_35;
      _auStack_38 = CONCAT17(local_35,uVar1);
      if (local_34 == 0x74697571) break;
      iVar3 = isprint(uVar5);
      uVar6 = (ulong)uVar5;
      if (iVar3 == 0) {
        uVar6 = 0x3f;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",uVar6,(ulong)uVar5,(ulong)uVar5);
      putchar(0xd);
      fflush(_stdout);
    }
    if (rawmode == '\x01') {
      iVar3 = tcsetattr(0,2,(termios *)&orig_termios);
      if (iVar3 != -1) {
        rawmode = '\0';
      }
    }
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
	char quit[4];

	printf("Linenoise key codes debugging mode.\n"
			   "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
	if (enableRawMode(STDIN_FILENO) == -1) return;
	memset(quit,' ',4);
	while(1) {
		char c;
		int nread;

		nread = read(STDIN_FILENO,&c,1);
		if (nread <= 0) continue;
		memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
		quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
		if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

		printf("'%c' %02x (%d) (type quit to exit)\n",
			   isprint(c) ? c : '?', (int)c, (int)c);
		printf("\r"); /* Go left edge manually, we are in raw mode. */
		fflush(stdout);
	}
	disableRawMode(STDIN_FILENO);
}